

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void Console::SetTextColor(Stream stream,Color color,bool bold)

{
  long lVar1;
  undefined8 *puVar2;
  undefined3 in_register_00000011;
  char command [8];
  undefined1 local_8 [3];
  char cStack_5;
  undefined4 uStack_4;
  
  if (CONCAT31(in_register_00000011,bold) == 0) {
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      local_8[lVar1 + 2] = *(undefined1 *)((long)&uStack_4 + lVar1);
    }
    _local_8 = CONCAT44(0x6d3033,CONCAT13(ansi_color_map[(long)(int)color * 4] + ';',0x315b1b));
  }
  else {
    _local_8 = CONCAT26(0x6d,CONCAT15(ansi_color_map[(long)(int)color * 4] + '0',0x333b315b1b));
  }
  if (stream == STREAM_OUT) {
    puVar2 = (undefined8 *)&stdout;
  }
  else {
    puVar2 = (undefined8 *)&stderr;
  }
  fputs(local_8,(FILE *)*puVar2);
  return;
}

Assistant:

void SetTextColor(Stream stream, Color color, bool bold)
{
	char command[8] = {27, '[', '1', ';', '3', '0', 'm', 0};

	if (bold)
	{
		command[5] += ansi_color_map[static_cast<int>(color)];
	}
	else
	{
		for (int i = 2; i < 6; ++i)
			command[i] = command[i + 2];

		command[3] += ansi_color_map[static_cast<int>(color)];
	}

	std::fputs(command, (stream == STREAM_OUT) ? stdout : stderr);
}